

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QString * operator+=(QString *a,QStringBuilder<QLatin1String_&,_QString_&> *b)

{
  ArrayOptions *pAVar1;
  __atomic_base<int> _Var2;
  QAbstractConcatenable *this;
  QLatin1String *pQVar3;
  Data *pDVar4;
  QLatin1String *out;
  long lVar5;
  char16_t *pcVar6;
  long lVar7;
  QLatin1String *alloc;
  char16_t *pcVar8;
  QLatin1StringView in;
  
  pDVar4 = (a->d).d;
  lVar5 = (a->d).size;
  out = b->a;
  alloc = (QLatin1String *)(out->m_size + lVar5 + (b->b->d).size);
  if ((pDVar4 == (Data *)0x0) ||
     (_Var2._M_i = (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i,
     out = (QLatin1String *)(ulong)(uint)_Var2._M_i, 1 < _Var2._M_i)) {
    QString::reallocData(a,lVar5,KeepSize);
    pDVar4 = (a->d).d;
    if (pDVar4 != (Data *)0x0) goto LAB_002df324;
    if (0 < (long)alloc) {
      out = (QLatin1String *)(a->d).size;
      goto LAB_002df379;
    }
  }
  else {
LAB_002df324:
    lVar5 = (pDVar4->super_QArrayData).alloc;
    out = (QLatin1String *)(a->d).size;
    lVar7 = (long)((long)(a->d).ptr -
                  ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 1
    ;
    if ((lVar5 - (long)out) - lVar7 < (long)alloc) {
      pQVar3 = (QLatin1String *)(lVar5 * 2);
      if (lVar5 * 2 < (long)alloc) {
        pQVar3 = alloc;
      }
      alloc = pQVar3;
      if ((1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i) ||
         (lVar5 - lVar7 <= (long)alloc)) {
LAB_002df379:
        if ((long)alloc < (long)out) {
          alloc = out;
        }
        QString::reallocData(a,(qsizetype)alloc,KeepSize);
        pDVar4 = (a->d).d;
        if (pDVar4 == (Data *)0x0) goto LAB_002df3a9;
        lVar5 = (pDVar4->super_QArrayData).alloc;
      }
      if (lVar5 != 0) {
        pAVar1 = &(pDVar4->super_QArrayData).flags;
        *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                  super_QFlagsStorage<QArrayData::ArrayOption>.i =
             (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                   super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
      }
    }
    if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)
    goto LAB_002df3ba;
  }
LAB_002df3a9:
  QString::reallocData(a,(a->d).size,KeepSize);
LAB_002df3ba:
  pcVar8 = (a->d).ptr + (a->d).size;
  this = (QAbstractConcatenable *)b->a->m_size;
  in.m_data = (char *)pcVar8;
  in.m_size = (qsizetype)b->a->m_data;
  QAbstractConcatenable::appendLatin1To(this,in,(QChar *)out);
  lVar5 = (b->b->d).size;
  if (lVar5 != 0) {
    pcVar6 = (b->b->d).ptr;
    if (pcVar6 == (char16_t *)0x0) {
      pcVar6 = &QString::_empty;
    }
    memcpy(pcVar8 + (long)this,pcVar6,lVar5 * 2);
  }
  pcVar6 = (a->d).ptr;
  if (pcVar6 == (char16_t *)0x0) {
    pcVar6 = &QString::_empty;
  }
  QString::resize(a,(long)(pcVar8 + (long)this) + (lVar5 * 2 - (long)pcVar6) >> 1);
  return a;
}

Assistant:

QString &operator+=(QString &a, const QStringBuilder<A, B> &b)
{
    qsizetype len = a.size() + QConcatenable< QStringBuilder<A, B> >::size(b);
    a.detach(); // a detach() in a.data() could reset a.capacity() to a.size()
    if (len > a.data_ptr().freeSpaceAtEnd()) // capacity() was broken when prepend()-optimization landed
        a.reserve(qMax(len, 2 * a.capacity()));
    QChar *it = a.data() + a.size();
    QConcatenable< QStringBuilder<A, B> >::appendTo(b, it);
    // we need to resize after the appendTo for the case str+=foo+str
    a.resize(it - a.constData()); //may be smaller than len if there was conversion from utf8
    return a;
}